

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void __thiscall duckdb::ColumnSegment::CommitDropSegment(ColumnSegment *this)

{
  compression_cleanup_state_t UNRECOVERED_JUMPTABLE;
  BlockHandle *pBVar1;
  
  if (this->block_id != -1) {
    pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&this->block);
    (*pBVar1->block_manager->_vptr_BlockManager[9])(pBVar1->block_manager,this->block_id);
  }
  UNRECOVERED_JUMPTABLE = ((this->function)._M_data)->cleanup_state;
  if (UNRECOVERED_JUMPTABLE != (compression_cleanup_state_t)0x0) {
    (*UNRECOVERED_JUMPTABLE)(this);
    return;
  }
  return;
}

Assistant:

void ColumnSegment::CommitDropSegment() {
	if (block_id != INVALID_BLOCK) {
		GetBlockManager().MarkBlockAsModified(block_id);
	}
	if (function.get().cleanup_state) {
		function.get().cleanup_state(*this);
	}
}